

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::FinishPartialCollect
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *next;
  code *pcVar1;
  anon_class_16_2_3fe61e0b fn;
  bool bVar2;
  Recycler *pRVar3;
  undefined4 *puVar4;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> **ppSVar5;
  bool local_61;
  bool local_51;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail_1;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *currentPartialHeapBlockList;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *local_28;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *partialSweptList;
  RecyclerSweep *recyclerSweep_local;
  SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  local_51 = false;
  partialSweptList =
       (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)recyclerSweep;
  recyclerSweep_local = (RecyclerSweep *)this;
  if (recyclerSweep != (RecyclerSweep *)0x0) {
    local_51 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,local_51);
  pRVar3 = HeapBucket::GetRecycler((HeapBucket *)this);
  if ((pRVar3->inPartialCollectMode & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x253,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((partialSweptList != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
     && (bVar2 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                 ::IsAllocationStopped
                           (&this->
                             super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                           ), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,600,"(recyclerSweep == nullptr || this->IsAllocationStopped())",
                       "recyclerSweep == nullptr || this->IsAllocationStopped()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  tail = this->partialSweptHeapBlockList;
  if (tail != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this->partialSweptHeapBlockList =
         (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    local_28 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    fn.tail = (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> **)&local_28;
    fn.this = this;
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinishPartialCollect(Memory::RecyclerSweep*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              (tail,fn);
    if (local_28 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x268,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
              (local_28,&this->partialHeapBlockList->
                         super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>);
    this->partialHeapBlockList = tail;
  }
  next = &this->partialHeapBlockList->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  if (partialSweptList == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
  {
    if (next != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
      AppendAllocableHeapBlockList
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                 ,(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)next);
    }
  }
  else {
    if (next != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      if ((this->
          super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          ).heapBlockList ==
          (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        (this->
        super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
        ).heapBlockList = (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)next;
      }
      else {
        this_00 = &HeapBlockList::
                   Tail<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                             ((this->
                              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                              ).heapBlockList)->
                   super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
        SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock(this_00,next);
      }
    }
    ppSVar5 = RecyclerSweep::
              GetPendingSweepBlockList<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                        ((RecyclerSweep *)partialSweptList,
                         &this->
                          super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                        );
    if (*ppSVar5 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                );
    }
  }
  local_61 = false;
  if (partialSweptList != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
  {
    local_61 = RecyclerSweep::IsBackground((RecyclerSweep *)partialSweptList);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,local_61);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));

    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped() || this->AllocationsStartedDuringConcurrentSweep());
#else
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped());
#endif

#if ENABLE_CONCURRENT_GC
    // Process the partial Swept block and move it to the partial heap block list
    TBlockType * partialSweptList = this->partialSweptHeapBlockList;
    if (partialSweptList)
    {
        this->partialSweptHeapBlockList = nullptr;
        TBlockType *  tail = nullptr;
        HeapBlockList::ForEach(partialSweptList, [this, &tail](TBlockType * heapBlock)
        {
            heapBlock->FinishPartialCollect();
            Assert(heapBlock->HasFreeObject());
            tail = heapBlock;
        });
        Assert(tail != nullptr);
        tail->SetNextBlock(this->partialHeapBlockList);
        this->partialHeapBlockList = partialSweptList;
    }
#endif

    TBlockType * currentPartialHeapBlockList = this->partialHeapBlockList;
    if (recyclerSweep == nullptr)
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            this->AppendAllocableHeapBlockList(currentPartialHeapBlockList);
        }
    }
    else
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            TBlockType * list = this->heapBlockList;
            if (list == nullptr)
            {
                this->heapBlockList = currentPartialHeapBlockList;
            }
            else
            {
                // CONCURRENT-TODO: Optimize this?
                TBlockType * tail = HeapBlockList::Tail(this->heapBlockList);
                tail->SetNextBlock(currentPartialHeapBlockList);
            }
        }
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr && !this->AllocationsStartedDuringConcurrentSweep())
#else
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr)
#endif
#endif
        {
            // nothing else to sweep now,  we can start allocating now.
            this->StartAllocationAfterSweep();
        }
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));
}